

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_force_close(intptr_t uuid)

{
  fio_packet_s *pfVar1;
  uint __fd;
  int *piVar2;
  long lVar3;
  fio_packet_s *tmp;
  fio_packet_s *packet;
  intptr_t uuid_local;
  
  if (((uuid < 0) || (__fd = (uint)((ulong)uuid >> 8), fio_data->capa <= __fd)) ||
     ((uuid & 0xffU) != (ulong)*(byte *)((long)fio_data + (long)(int)__fd * 0xa8 + 0x6d))) {
    piVar2 = __errno_location();
    *piVar2 = 9;
  }
  else {
    if (*(char *)((long)fio_data + (long)(int)__fd * 0xa8 + 0x70) == '\0') {
      *(undefined1 *)((long)fio_data + (long)(int)__fd * 0xa8 + 0x70) = 1;
    }
    fio_lock((fio_lock_i *)((long)fio_data + (long)(int)__fd * 0xa8 + 0x6e));
    tmp = *(fio_packet_s **)((long)fio_data + (long)(int)__fd * 0xa8 + 0x40);
    *(undefined8 *)((long)fio_data + (long)(int)__fd * 0xa8 + 0x40) = 0;
    *(long *)((long)fio_data + (long)(int)__fd * 0xa8 + 0x48) =
         (long)fio_data + (long)(int)__fd * 0xa8 + 0x40;
    *(undefined8 *)((long)fio_data + (long)(int)__fd * 0xa8 + 0x50) = 0;
    fio_unlock((fio_lock_i *)((long)fio_data + (long)(int)__fd * 0xa8 + 0x6e));
    while (tmp != (fio_packet_s *)0x0) {
      pfVar1 = tmp->next;
      fio_packet_free(tmp);
      tmp = pfVar1;
    }
    if (((*(char *)((long)fio_data + (long)(int)__fd * 0xa8 + 0x6f) != '\0') &&
        ((*(byte *)((long)fio_data + (long)(int)__fd * 0xa8 + 0x70) & 1) != 0)) &&
       (lVar3 = (**(code **)(*(long *)((long)fio_data + (long)(int)__fd * 0xa8 + 0xa8) + 0x18))
                          (uuid), lVar3 != 0)) {
      *(undefined1 *)((long)fio_data + (long)(int)__fd * 0xa8 + 0x70) = 2;
      fio_touch(uuid);
      fio_poll_add_write((long)(int)__fd);
      return;
    }
    fio_lock((fio_lock_i *)((long)fio_data + (long)(int)__fd * 0xa8 + 0x6c));
    fio_clear_fd((long)(int)__fd,'\0');
    fio_unlock((fio_lock_i *)((long)fio_data + (long)(int)__fd * 0xa8 + 0x6c));
    close(__fd);
    if (fio_data->connection_count != 0) {
      LOCK();
      fio_data->connection_count = fio_data->connection_count - 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void fio_force_close(intptr_t uuid) {
  if (!uuid_is_valid(uuid)) {
    errno = EBADF;
    return;
  }
  // FIO_LOG_DEBUG("fio_force_close called for uuid %p", (void *)uuid);
  /* make sure the close marker is set */
  if (!uuid_data(uuid).close)
    uuid_data(uuid).close = 1;
  /* clear away any packets in case we want to cut the connection short. */
  fio_packet_s *packet = NULL;
  fio_lock(&uuid_data(uuid).sock_lock);
  packet = uuid_data(uuid).packet;
  uuid_data(uuid).packet = NULL;
  uuid_data(uuid).packet_last = &uuid_data(uuid).packet;
  uuid_data(uuid).sent = 0;
  fio_unlock(&uuid_data(uuid).sock_lock);
  while (packet) {
    fio_packet_s *tmp = packet;
    packet = packet->next;
    fio_packet_free(tmp);
  }
  /* check for rw-hooks termination packet */
  if (uuid_data(uuid).open && (uuid_data(uuid).close & 1) &&
      uuid_data(uuid).rw_hooks->before_close(uuid, uuid_data(uuid).rw_udata)) {
    uuid_data(uuid).close = 2; /* don't repeat the before_close callback */
    fio_touch(uuid);
    fio_poll_add_write(fio_uuid2fd(uuid));
    return;
  }
  fio_lock(&uuid_data(uuid).protocol_lock);
  fio_clear_fd(fio_uuid2fd(uuid), 0);
  fio_unlock(&uuid_data(uuid).protocol_lock);
  close(fio_uuid2fd(uuid));
#if FIO_ENGINE_POLL
  fio_poll_remove_fd(fio_uuid2fd(uuid));
#endif
  if (fio_data->connection_count)
    fio_atomic_sub(&fio_data->connection_count, 1);
}